

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psbt.c
# Opt level: O0

int pull_psbt_output(uchar **cursor,size_t *max,wally_psbt_output *result)

{
  _Bool _Var1;
  int iVar2;
  uint64_t uVar3;
  uchar *puVar4;
  size_t key_len_00;
  uint64_t id_len;
  uchar *key;
  uchar *vl_p;
  uchar *pre_key;
  size_t vl_len;
  size_t key_len;
  wally_psbt_output *pwStack_28;
  int ret;
  wally_psbt_output *result_local;
  size_t *max_local;
  uchar **cursor_local;
  
  vl_p = *cursor;
  pwStack_28 = result;
  result_local = (wally_psbt_output *)max;
  max_local = (size_t *)cursor;
  do {
    vl_len = pull_varlength((uchar **)max_local,(size_t *)result_local);
    if (vl_len == 0) {
      return 0;
    }
    pull_subfield_start((uchar **)max_local,(size_t *)result_local,vl_len,(uchar **)&id_len,&vl_len)
    ;
    uVar3 = pull_varint((uchar **)&id_len,&vl_len);
    if (uVar3 == 0) {
      if (pwStack_28->redeem_script != (uchar *)0x0) {
        return -2;
      }
      subfield_nomore_end((uchar **)max_local,(size_t *)result_local,(uchar *)id_len,vl_len);
      fetch_varlength_ptr(&key,(size_t *)&pre_key,(uchar **)max_local,(size_t *)result_local);
      if (pre_key == (uchar *)0x0) {
        puVar4 = (uchar *)wally_malloc(1);
        pwStack_28->redeem_script = puVar4;
      }
      else {
        iVar2 = wally_psbt_output_set_redeem_script(pwStack_28,key,(size_t)pre_key);
        if (iVar2 != 0) {
          return iVar2;
        }
        key_len._4_4_ = 0;
      }
    }
    else if (uVar3 == 1) {
      if (pwStack_28->witness_script != (uchar *)0x0) {
        return -2;
      }
      subfield_nomore_end((uchar **)max_local,(size_t *)result_local,(uchar *)id_len,vl_len);
      fetch_varlength_ptr(&key,(size_t *)&pre_key,(uchar **)max_local,(size_t *)result_local);
      if (pre_key == (uchar *)0x0) {
        puVar4 = (uchar *)wally_malloc(1);
        pwStack_28->witness_script = puVar4;
      }
      else {
        iVar2 = wally_psbt_output_set_witness_script(pwStack_28,key,(size_t)pre_key);
        if (iVar2 != 0) {
          return iVar2;
        }
        key_len._4_4_ = 0;
      }
    }
    else if (uVar3 == 2) {
      iVar2 = pull_map((uchar **)max_local,(size_t *)result_local,(uchar *)id_len,vl_len,
                       &pwStack_28->keypaths,wally_ec_public_key_verify);
      if (iVar2 != 0) {
        return iVar2;
      }
      key_len._4_4_ = 0;
    }
    else {
      if (uVar3 == 0xfc) {
        key_len_00 = pull_varlength((uchar **)&id_len,&vl_len);
        _Var1 = is_elements_prefix((uchar *)id_len,key_len_00);
        if (_Var1) {
          pull_skip((uchar **)&id_len,&vl_len,8);
          uVar3 = pull_varint((uchar **)&id_len,&vl_len);
          switch(uVar3) {
          case 0:
            if (pwStack_28->value_commitment != (uchar *)0x0) {
              return -2;
            }
            subfield_nomore_end((uchar **)max_local,(size_t *)result_local,(uchar *)id_len,vl_len);
            fetch_varlength_ptr(&key,(size_t *)&pre_key,(uchar **)max_local,(size_t *)result_local);
            if (pre_key == (uchar *)0x0) {
              puVar4 = (uchar *)wally_malloc(1);
              pwStack_28->value_commitment = puVar4;
            }
            else {
              iVar2 = wally_psbt_output_set_value_commitment(pwStack_28,key,(size_t)pre_key);
              if (iVar2 != 0) {
                return iVar2;
              }
              key_len._4_4_ = 0;
            }
            break;
          case 1:
            if (pwStack_28->vbf != (uchar *)0x0) {
              return -2;
            }
            subfield_nomore_end((uchar **)max_local,(size_t *)result_local,(uchar *)id_len,vl_len);
            fetch_varlength_ptr(&key,(size_t *)&pre_key,(uchar **)max_local,(size_t *)result_local);
            if (pre_key == (uchar *)0x0) {
              puVar4 = (uchar *)wally_malloc(1);
              pwStack_28->vbf = puVar4;
            }
            else {
              iVar2 = wally_psbt_output_set_vbf(pwStack_28,key,(size_t)pre_key);
              if (iVar2 != 0) {
                return iVar2;
              }
              key_len._4_4_ = 0;
            }
            break;
          case 2:
            if (pwStack_28->asset_commitment != (uchar *)0x0) {
              return -2;
            }
            subfield_nomore_end((uchar **)max_local,(size_t *)result_local,(uchar *)id_len,vl_len);
            fetch_varlength_ptr(&key,(size_t *)&pre_key,(uchar **)max_local,(size_t *)result_local);
            if (pre_key == (uchar *)0x0) {
              puVar4 = (uchar *)wally_malloc(1);
              pwStack_28->asset_commitment = puVar4;
            }
            else {
              iVar2 = wally_psbt_output_set_asset_commitment(pwStack_28,key,(size_t)pre_key);
              if (iVar2 != 0) {
                return iVar2;
              }
              key_len._4_4_ = 0;
            }
            break;
          case 3:
            if (pwStack_28->abf != (uchar *)0x0) {
              return -2;
            }
            subfield_nomore_end((uchar **)max_local,(size_t *)result_local,(uchar *)id_len,vl_len);
            fetch_varlength_ptr(&key,(size_t *)&pre_key,(uchar **)max_local,(size_t *)result_local);
            if (pre_key == (uchar *)0x0) {
              puVar4 = (uchar *)wally_malloc(1);
              pwStack_28->abf = puVar4;
            }
            else {
              iVar2 = wally_psbt_output_set_abf(pwStack_28,key,(size_t)pre_key);
              if (iVar2 != 0) {
                return iVar2;
              }
              key_len._4_4_ = 0;
            }
            break;
          case 4:
            if (pwStack_28->rangeproof != (uchar *)0x0) {
              return -2;
            }
            subfield_nomore_end((uchar **)max_local,(size_t *)result_local,(uchar *)id_len,vl_len);
            fetch_varlength_ptr(&key,(size_t *)&pre_key,(uchar **)max_local,(size_t *)result_local);
            if (pre_key == (uchar *)0x0) {
              puVar4 = (uchar *)wally_malloc(1);
              pwStack_28->rangeproof = puVar4;
            }
            else {
              iVar2 = wally_psbt_output_set_rangeproof(pwStack_28,key,(size_t)pre_key);
              if (iVar2 != 0) {
                return iVar2;
              }
              key_len._4_4_ = 0;
            }
            break;
          case 5:
            if (pwStack_28->surjectionproof != (uchar *)0x0) {
              return -2;
            }
            subfield_nomore_end((uchar **)max_local,(size_t *)result_local,(uchar *)id_len,vl_len);
            fetch_varlength_ptr(&key,(size_t *)&pre_key,(uchar **)max_local,(size_t *)result_local);
            if (pre_key == (uchar *)0x0) {
              puVar4 = (uchar *)wally_malloc(1);
              pwStack_28->surjectionproof = puVar4;
            }
            else {
              iVar2 = wally_psbt_output_set_surjectionproof(pwStack_28,key,(size_t)pre_key);
              if (iVar2 != 0) {
                return iVar2;
              }
              key_len._4_4_ = 0;
            }
            break;
          case 6:
            if (pwStack_28->blinding_pubkey != (uchar *)0x0) {
              return -2;
            }
            subfield_nomore_end((uchar **)max_local,(size_t *)result_local,(uchar *)id_len,vl_len);
            fetch_varlength_ptr(&key,(size_t *)&pre_key,(uchar **)max_local,(size_t *)result_local);
            if (pre_key == (uchar *)0x0) {
              puVar4 = (uchar *)wally_malloc(1);
              pwStack_28->blinding_pubkey = puVar4;
            }
            else {
              iVar2 = wally_psbt_output_set_blinding_pubkey(pwStack_28,key,(size_t)pre_key);
              if (iVar2 != 0) {
                return iVar2;
              }
              key_len._4_4_ = 0;
            }
            break;
          case 7:
            if (pwStack_28->nonce != (uchar *)0x0) {
              return -2;
            }
            subfield_nomore_end((uchar **)max_local,(size_t *)result_local,(uchar *)id_len,vl_len);
            fetch_varlength_ptr(&key,(size_t *)&pre_key,(uchar **)max_local,(size_t *)result_local);
            if (pre_key == (uchar *)0x0) {
              puVar4 = (uchar *)wally_malloc(1);
              pwStack_28->nonce = puVar4;
            }
            else {
              iVar2 = wally_psbt_output_set_nonce(pwStack_28,key,(size_t)pre_key);
              if (iVar2 != 0) {
                return iVar2;
              }
              key_len._4_4_ = 0;
            }
            break;
          default:
            goto switchD_0063bf43_default;
          }
          goto LAB_0063c3df;
        }
      }
switchD_0063bf43_default:
      iVar2 = pull_unknown_key_value
                        ((uchar **)max_local,(size_t *)result_local,vl_p,&pwStack_28->unknowns);
      if (iVar2 != 0) {
        return iVar2;
      }
      key_len._4_4_ = 0;
    }
LAB_0063c3df:
    vl_p = (uchar *)*max_local;
  } while( true );
}

Assistant:

static int pull_psbt_output(const unsigned char **cursor, size_t *max,
                            struct wally_psbt_output *result)
{
    int ret;
    size_t key_len, vl_len;
    const unsigned char *pre_key, *vl_p;

    /* Read key value */
    pre_key = *cursor;
    while ((key_len = pull_varlength(cursor, max)) != 0) {
        const unsigned char *key;

        /* Start parsing key */
        pull_subfield_start(cursor, max, key_len, &key, &key_len);

        /* Process based on type */
        switch (pull_varint(&key, &key_len)) {
        case PSBT_OUT_REDEEM_SCRIPT:
            PSBT_PULL_B(output, redeem_script);
            break;
        case PSBT_OUT_WITNESS_SCRIPT:
            PSBT_PULL_B(output, witness_script);
            break;
        case PSBT_OUT_BIP32_DERIVATION:
            if ((ret = pull_map(cursor, max, key, key_len, &result->keypaths,
                                wally_ec_public_key_verify)) != WALLY_OK)
                return ret;
            break;
#ifdef BUILD_ELEMENTS
        case PSBT_PROPRIETARY_TYPE: {
            const uint64_t id_len = pull_varlength(&key, &key_len);

            if (!is_elements_prefix(key, id_len))
                goto unknown_type;

            /* Skip the elements_id prefix */
            pull_skip(&key, &key_len, sizeof(PSET_KEY_PREFIX));

            switch (pull_varint(&key, &key_len)) {
            case PSET_OUT_VALUE_COMMITMENT:
                PSBT_PULL_B(output, value_commitment);
                break;
            case PSET_OUT_VALUE_BLINDER:
                PSBT_PULL_B(output, vbf);
                break;
            case PSET_OUT_ASSET_COMMITMENT:
                PSBT_PULL_B(output, asset_commitment);
                break;
            case PSET_OUT_ASSET_BLINDER:
                PSBT_PULL_B(output, abf);
                break;
            case PSET_OUT_RANGE_PROOF:
                PSBT_PULL_B(output, rangeproof);
                break;
            case PSET_OUT_SURJECTION_PROOF:
                PSBT_PULL_B(output, surjectionproof);
                break;
            case PSET_OUT_BLINDING_PUBKEY:
                PSBT_PULL_B(output, blinding_pubkey);
                break;
            case PSET_OUT_NONCE_COMMITMENT:
                PSBT_PULL_B(output, nonce);
                break;
            default:
                goto unknown_type;
            }
            break;
        }
#endif /* BUILD_ELEMENTS */
        default: {
unknown_type:
            /* Unknown case without elements or for unknown proprietary types */
            ret = pull_unknown_key_value(cursor, max, pre_key, &result->unknowns);
            if (ret != WALLY_OK)
                return ret;
            break;
        }
        }
        pre_key = *cursor;
    }

    return WALLY_OK;
}